

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::
ArrayBuilder<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
::truncate(ArrayBuilder<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
           *this,char *__file,__off_t __length)

{
  Entry *pEVar1;
  AnnotatedHandler *pAVar2;
  Disposer *pDVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  
  pEVar1 = this->ptr;
  pEVar5 = this->pos;
  while (pEVar4 = pEVar5, pEVar1 + (long)__file < pEVar4) {
    this->pos = pEVar4 + -1;
    pAVar2 = pEVar4[-1].value.ptr.ptr;
    pEVar5 = pEVar4 + -1;
    if (pAVar2 != (AnnotatedHandler *)0x0) {
      pEVar4[-1].value.ptr.ptr = (AnnotatedHandler *)0x0;
      pDVar3 = pEVar4[-1].value.ptr.disposer;
      (**pDVar3->_vptr_Disposer)
                (pDVar3,(pAVar2->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                        super_HandlerBase._vptr_HandlerBase[-2] +
                        (long)&(pAVar2->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).
                               super_HandlerBase._vptr_HandlerBase);
      pEVar5 = this->pos;
    }
  }
  return (int)pEVar4;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }